

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_fetching.c
# Opt level: O0

greatest_test_res db_all_trips_fetch(void)

{
  uint uVar1;
  int iVar2;
  int local_60;
  int i;
  int retrieved_count;
  trip_t *records;
  feed_db_t db;
  trip_t *ptStack_20;
  int expected_count;
  trip_t *expected;
  FILE *fp;
  
  expected = (trip_t *)fopen("../tests/data/stupid_gtfs/trips.txt","r");
  if (expected == (trip_t *)0x0) {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
    ;
    greatest_info.fail_line = 0x1e0;
    greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/trips.txt` test file";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  else {
    db._36_4_ = read_all_trips((FILE *)expected,&stack0xffffffffffffffe0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (db._36_4_ == 4) {
      init_feed_db((feed_db_t *)&records,"tests_storing.db",1);
      setup_feed_db((feed_db_t *)&records);
      uVar1 = fetch_all_trips_db((feed_db_t *)&records,(trip_t **)&i);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (db._36_4_ == uVar1) {
        for (local_60 = 0; local_60 < (int)uVar1; local_60 = local_60 + 1) {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar2 = equal_trip(ptStack_20 + local_60,_i + local_60);
          if (iVar2 == 0) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
            ;
            greatest_info.fail_line = 0x1f2;
            greatest_info.msg = "equal_trip(&(expected[i]), &(records[i]))";
            if ((greatest_info.flags & 4) == 0) {
              greatest_info.fail_line = 0x1f2;
              greatest_info.fail_file =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
              ;
              greatest_info.msg = "equal_trip(&(expected[i]), &(records[i]))";
              return GREATEST_TEST_RES_FAIL;
            }
            abort();
          }
        }
        free_feed_db((feed_db_t *)&records);
        if (0 < (int)uVar1) {
          free(_i);
        }
        if (0 < (int)db._36_4_) {
          free(ptStack_20);
        }
        if (expected != (trip_t *)0x0) {
          fclose((FILE *)expected);
        }
        greatest_info.msg = (char *)0x0;
        fp._4_4_ = GREATEST_TEST_RES_PASS;
      }
      else {
        fprintf(_stdout,"\nExpected: ");
        fprintf(_stdout,"%i",(ulong)(uint)db._36_4_);
        fprintf(_stdout,"\n     Got: ");
        fprintf(_stdout,"%i",(ulong)uVar1);
        fprintf(_stdout,"\n");
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x1f0;
        greatest_info.msg = "expected_count != retrieved_count";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        fp._4_4_ = GREATEST_TEST_RES_FAIL;
      }
    }
    else {
      fprintf(_stdout,"\nExpected: ");
      fprintf(_stdout,"%i",4);
      fprintf(_stdout,"\n     Got: ");
      fprintf(_stdout,"%i",(ulong)(uint)db._36_4_);
      fprintf(_stdout,"\n");
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      greatest_info.fail_line = 0x1e5;
      greatest_info.msg = "4 != expected_count";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      fp._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  return fp._4_4_;
}

Assistant:

TEST db_all_trips_fetch(void) {

    FILE *fp = fopen("../tests/data/stupid_gtfs/trips.txt", "r");
    if (fp == NULL) {
        FAILm("Couldn't open `data/stupid_gtfs/trips.txt` test file");
    } else {
        trip_t *expected;
        int expected_count = read_all_trips(fp, &expected);

        ASSERT_EQ_FMT(4, expected_count, "%i");


        feed_db_t db;
        trip_t *records;

        init_feed_db(&db, "tests_storing.db", 1);
        setup_feed_db(&db);

        int retrieved_count = fetch_all_trips_db(&db, &records);

        ASSERT_EQ_FMT(expected_count, retrieved_count, "%i");
        for (int i = 0; i < retrieved_count; i++)
            ASSERT(equal_trip(&(expected[i]), &(records[i])));


        free_feed_db(&db);
        if (retrieved_count > 0) free(records);
        if (expected_count > 0) free(expected);
        if (fp) fclose(fp);
    }
    PASS();
}